

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

SerializedMessage *
miniros::serialization::serializeServiceResponse<roscpp::EmptyResponse_<std::allocator<void>>>
          (bool ok,EmptyResponse_<std::allocator<void>_> *message)

{
  uint32_t uVar1;
  OStream *this;
  byte in_SIL;
  SerializedMessage *in_RDI;
  OStream s_1;
  uint32_t len_1;
  OStream s;
  uint32_t len;
  SerializedMessage *m;
  EmptyResponse_<std::allocator<void>_> *in_stack_ffffffffffffff58;
  SerializedMessage *pSVar2;
  SerializedMessage *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff70;
  
  SerializedMessage::SerializedMessage(in_stack_ffffffffffffff60);
  if ((in_SIL & 1) == 0) {
    uVar1 = serializationLength<roscpp::EmptyResponse_<std::allocator<void>>>
                      ((EmptyResponse_<std::allocator<void>_> *)0x44d00a);
    in_RDI->num_bytes = (ulong)(uVar1 + 1);
    pSVar2 = in_RDI;
    this = (OStream *)operator_new__(in_RDI->num_bytes);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              (in_stack_ffffffffffffff70,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffff68));
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    OStream::OStream(this,(uint8_t *)pSVar2,0);
    serialize<unsigned_char,miniros::serialization::OStream>(this,(uchar *)pSVar2);
    serialize<roscpp::EmptyResponse_<std::allocator<void>>,miniros::serialization::OStream>
              (this,(EmptyResponse_<std::allocator<void>_> *)pSVar2);
  }
  else {
    uVar1 = serializationLength<roscpp::EmptyResponse_<std::allocator<void>>>
                      ((EmptyResponse_<std::allocator<void>_> *)0x44cf18);
    in_RDI->num_bytes = (ulong)(uVar1 + 5);
    pSVar2 = in_RDI;
    operator_new__(in_RDI->num_bytes);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)pSVar2,
               (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    OStream::OStream((OStream *)in_stack_ffffffffffffff60,(uint8_t *)in_stack_ffffffffffffff58,0);
    serialize<unsigned_char,miniros::serialization::OStream>
              ((OStream *)in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58);
    serialize<unsigned_int,miniros::serialization::OStream>
              ((OStream *)in_stack_ffffffffffffff60,(uint *)in_stack_ffffffffffffff58);
    serialize<roscpp::EmptyResponse_<std::allocator<void>>,miniros::serialization::OStream>
              ((OStream *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}